

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(void)

{
  thread *this;
  _List_node_base *p_Var1;
  int iVar2;
  _Head_base<0UL,_std::thread_*,_false> local_230;
  _Any_data local_228;
  long local_218;
  undefined8 local_210;
  list<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
  threads;
  _Any_data local_1e8;
  long local_1d8;
  undefined8 uStack_1d0;
  _Bind<void_(*(int,_capture_thread::testing::CallbackQueue_*))(int,_capture_thread::testing::CallbackQueue_*)>
  local_1c8;
  code *local_1b0 [4];
  string local_190;
  function<void_()> local_170;
  function<void_()> local_150;
  CallbackQueue queue;
  Tracing context;
  
  std::__cxx11::string::string((string *)&local_190,"main",(allocator *)&queue);
  demo::Tracing::Tracing(&context,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  capture_thread::testing::CallbackQueue::CallbackQueue(&queue,false);
  for (iVar2 = 0; iVar2 != 10; iVar2 = iVar2 + 1) {
    local_1b0[0] = anon_unknown.dwarf_9174::Compute;
    local_1b0[1]._0_4_ = iVar2;
    std::function<void()>::function<std::_Bind<void(*(int))(int)>,void>
              ((function<void()> *)&local_170,(_Bind<void_(*(int))(int)> *)local_1b0);
    capture_thread::ThreadCrosser::WrapCall(&local_150,&local_170);
    capture_thread::testing::CallbackQueue::Push(&queue,&local_150);
    std::_Function_base::~_Function_base(&local_150.super__Function_base);
    std::_Function_base::~_Function_base(&local_170.super__Function_base);
  }
  threads.
  super__List_base<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&threads;
  threads.
  super__List_base<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
  ._M_impl._M_node._M_size = 0;
  threads.
  super__List_base<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       threads.
       super__List_base<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  for (iVar2 = 0; iVar2 != 3; iVar2 = iVar2 + 1) {
    local_1c8._M_f = anon_unknown.dwarf_9174::QueueThread;
    local_1c8._M_bound_args.super__Tuple_impl<0UL,_int,_capture_thread::testing::CallbackQueue_*>.
    super__Tuple_impl<1UL,_capture_thread::testing::CallbackQueue_*>.
    super__Head_base<1UL,_capture_thread::testing::CallbackQueue_*,_false>._M_head_impl =
         (_Head_base<1UL,_capture_thread::testing::CallbackQueue_*,_false>)&queue;
    local_1c8._M_bound_args.super__Tuple_impl<0UL,_int,_capture_thread::testing::CallbackQueue_*>.
    super__Head_base<0UL,_int,_false>._M_head_impl = iVar2;
    std::function<void()>::
    function<std::_Bind<void(*(int,capture_thread::testing::CallbackQueue*))(int,capture_thread::testing::CallbackQueue*)>,void>
              ((function<void()> *)local_1e8._M_pod_data,&local_1c8);
    this = (thread *)operator_new(8);
    local_228._M_unused._M_object = (void *)0x0;
    local_228._8_8_ = 0;
    local_218 = 0;
    local_210 = uStack_1d0;
    if (local_1d8 != 0) {
      local_228._M_unused._M_object = local_1e8._M_unused._M_object;
      local_228._8_8_ = local_1e8._8_8_;
      local_218 = local_1d8;
      local_1d8 = 0;
      uStack_1d0 = 0;
    }
    capture_thread::ThreadCrosser::WrapCall
              ((function<void_()> *)local_1b0,(function<void_()> *)&local_228);
    std::thread::thread<std::function<void()>,,void>(this,(function<void_()> *)local_1b0);
    local_230._M_head_impl = this;
    std::_Function_base::~_Function_base((_Function_base *)local_1b0);
    std::_Function_base::~_Function_base((_Function_base *)&local_228);
    std::__cxx11::
    list<std::unique_ptr<std::thread,std::default_delete<std::thread>>,std::allocator<std::unique_ptr<std::thread,std::default_delete<std::thread>>>>
    ::emplace_back<std::unique_ptr<std::thread,std::default_delete<std::thread>>>
              ((list<std::unique_ptr<std::thread,std::default_delete<std::thread>>,std::allocator<std::unique_ptr<std::thread,std::default_delete<std::thread>>>>
                *)&threads,(unique_ptr<std::thread,_std::default_delete<std::thread>_> *)&local_230)
    ;
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
              ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)&local_230);
    std::_Function_base::~_Function_base((_Function_base *)&local_1e8);
  }
  capture_thread::testing::CallbackQueue::Activate(&queue);
  capture_thread::testing::CallbackQueue::WaitUntilEmpty(&queue);
  capture_thread::testing::CallbackQueue::Terminate(&queue);
  p_Var1 = (_List_node_base *)&threads;
  while (p_Var1 = (((_List_base<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&threads) {
    std::thread::join();
  }
  std::__cxx11::
  _List_base<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
  ::_M_clear(&threads.
              super__List_base<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
            );
  capture_thread::testing::CallbackQueue::~CallbackQueue(&queue);
  demo::Tracing::~Tracing(&context);
  return 0;
}

Assistant:

int main() {
  Tracing context(__func__);

  // Queue for passing work from the main thread to the worker threads. Created
  // in a paused state.
  CallbackQueue queue(false /*active*/);

  for (int i = 0; i < 10; ++i) {
    // One callback per unit of work that can be parallelized.
    queue.Push(ThreadCrosser::WrapCall(std::bind(&Compute, i)));
  }

  std::list<std::unique_ptr<std::thread>> threads;
  for (int i = 0; i < 3; ++i) {
    // An arbitrary number of threads.
    threads.emplace_back(NewThread(std::bind(&QueueThread, i, &queue)));
  }

  // Perform the computations.

  queue.Activate();
  queue.WaitUntilEmpty();
  queue.Terminate();

  for (const auto& thread : threads) {
    thread->join();
  }
}